

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereAddLimitExpr(WhereClause *pWC,int iReg,Expr *pExpr,int iCsr,int eMatchOp)

{
  WhereTerm *pWVar1;
  int iVar2;
  Expr *pEVar3;
  int idx;
  WhereTerm *pTerm;
  Expr *pVal_1;
  Expr *pVal;
  Expr *pEStack_40;
  int iVal;
  Expr *pNew;
  sqlite3 *db;
  Parse *pParse;
  int eMatchOp_local;
  int iCsr_local;
  Expr *pExpr_local;
  WhereClause *pWStack_10;
  int iReg_local;
  WhereClause *pWC_local;
  
  db = (sqlite3 *)pWC->pWInfo->pParse;
  pNew = (Expr *)db->pVfs;
  pVal._4_4_ = 0;
  pParse._0_4_ = eMatchOp;
  pParse._4_4_ = iCsr;
  _eMatchOp_local = pExpr;
  pExpr_local._4_4_ = iReg;
  pWStack_10 = pWC;
  iVar2 = sqlite3ExprIsInteger(pExpr,(int *)((long)&pVal + 4));
  if ((iVar2 == 0) || (pVal._4_4_ < 0)) {
    pEVar3 = sqlite3Expr((sqlite3 *)pNew,0xb0,(char *)0x0);
    if (pEVar3 == (Expr *)0x0) {
      return;
    }
    pEVar3->iTable = pExpr_local._4_4_;
    pEStack_40 = sqlite3PExpr((Parse *)db,0x2e,(Expr *)0x0,pEVar3);
  }
  else {
    pEVar3 = sqlite3Expr((sqlite3 *)pNew,0x9b,(char *)0x0);
    if (pEVar3 == (Expr *)0x0) {
      return;
    }
    pEVar3->flags = pEVar3->flags | 0x800;
    (pEVar3->u).iValue = pVal._4_4_;
    pEStack_40 = sqlite3PExpr((Parse *)db,0x2e,(Expr *)0x0,pEVar3);
  }
  if (pEStack_40 != (Expr *)0x0) {
    iVar2 = whereClauseInsert(pWStack_10,pEStack_40,3);
    pWVar1 = pWStack_10->a;
    pWVar1[iVar2].leftCursor = pParse._4_4_;
    pWVar1[iVar2].eOperator = 0x40;
    pWVar1[iVar2].eMatchOp = (u8)(int)pParse;
  }
  return;
}

Assistant:

static void whereAddLimitExpr(
  WhereClause *pWC,   /* Add the constraint to this WHERE clause */
  int iReg,           /* Register that will hold value of the limit/offset */
  Expr *pExpr,        /* Expression that defines the limit/offset */
  int iCsr,           /* Cursor to which the constraint applies */
  int eMatchOp        /* SQLITE_INDEX_CONSTRAINT_LIMIT or _OFFSET */
){
  Parse *pParse = pWC->pWInfo->pParse;
  sqlite3 *db = pParse->db;
  Expr *pNew;
  int iVal = 0;

  if( sqlite3ExprIsInteger(pExpr, &iVal) && iVal>=0 ){
    Expr *pVal = sqlite3Expr(db, TK_INTEGER, 0);
    if( pVal==0 ) return;
    ExprSetProperty(pVal, EP_IntValue);
    pVal->u.iValue = iVal;
    pNew = sqlite3PExpr(pParse, TK_MATCH, 0, pVal);
  }else{
    Expr *pVal = sqlite3Expr(db, TK_REGISTER, 0);
    if( pVal==0 ) return;
    pVal->iTable = iReg;
    pNew = sqlite3PExpr(pParse, TK_MATCH, 0, pVal);
  }
  if( pNew ){
    WhereTerm *pTerm;
    int idx;
    idx = whereClauseInsert(pWC, pNew, TERM_DYNAMIC|TERM_VIRTUAL);
    pTerm = &pWC->a[idx];
    pTerm->leftCursor = iCsr;
    pTerm->eOperator = WO_AUX;
    pTerm->eMatchOp = eMatchOp;
  }
}